

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_draw.cxx
# Opt level: O1

void gl_draw(char *str,int n)

{
  int iVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  unsigned_short id;
  XFontStruct *font;
  unsigned_short local_46;
  uint local_44;
  char *local_40;
  XFontStruct *local_38;
  
  local_40 = str;
  local_44 = fl_utf8toUtf16(str,n,gl_draw::buf,gl_draw::l);
  if (gl_draw::l <= (int)local_44) {
    gl_draw::buf = (unsigned_short *)realloc(gl_draw::buf,(ulong)local_44 * 2 + 2);
    gl_draw::l = local_44 + 1;
    local_44 = fl_utf8toUtf16(local_40,n,gl_draw::buf,local_44 + 1);
  }
  if (0 < (int)local_44) {
    uVar4 = (ulong)local_44;
    uVar2 = 0;
    do {
      uVar3 = (uint)(int)local_40[uVar2] >> 10 & 0x3f;
      if (gl_fontsize->glok[uVar3] == '\0') {
        gl_fontsize->glok[uVar3] = '\x01';
        uVar3 = uVar3 << 10;
        iVar1 = 0x400;
        do {
          local_38 = (XFontStruct *)0x0;
          fl_XGetUtf8FontAndGlyph(gl_fontsize->font,uVar3,&local_38,&local_46);
          if (local_38 != (XFontStruct *)0x0) {
            glXUseXFont(local_38->fid,local_46,1,gl_fontsize->listbase + uVar3);
          }
          uVar3 = uVar3 + 1;
          iVar1 = iVar1 + -1;
        } while (iVar1 != 0);
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 != uVar4);
  }
  glCallLists(local_44,0x1403,gl_draw::buf);
  return;
}

Assistant:

void gl_draw(const char* str, int n) {
#ifdef __APPLE__  
  gl_draw_textures(str, n);
#else
  static xchar *buf = NULL;
  static int l = 0;
  int wn = fl_utf8toUtf16(str, n, (unsigned short*)buf, l);
  if(wn >= l) {
    buf = (xchar*) realloc(buf, sizeof(xchar) * (wn + 1));
    l = wn + 1;
    wn = fl_utf8toUtf16(str, n, (unsigned short*)buf, l);
  }
  n = wn;

  int i;
  for (i = 0; i < n; i++) {
    unsigned int r;
    r = (str[i] & 0xFC00) >> 10;
    if (!gl_fontsize->glok[r]) get_list(r);
  }
  glCallLists(n, GL_UNSIGNED_SHORT, buf);
#endif
}